

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_subcommands_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *app,AppFormatMode mode)

{
  App *this_00;
  pointer pbVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  ostream *poVar3;
  pointer ppAVar4;
  pointer ppAVar5;
  pointer pbVar6;
  string group_key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subcmd_groups_seen;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands_group;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  string local_1d8;
  stringstream out;
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  group_key.field_2._M_allocated_capacity = 0;
  group_key.field_2._8_8_ = 0;
  group_key._M_dataplus._M_p = (pointer)0x0;
  group_key._M_string_length = 0;
  App::get_subcommands(&subcommands,app,(function<bool_(const_CLI::App_*)> *)&group_key);
  std::_Function_base::~_Function_base((_Function_base *)&group_key);
  subcmd_groups_seen.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  subcmd_groups_seen.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subcmd_groups_seen.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (ppAVar5 = subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = subcmd_groups_seen.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      ppAVar5 !=
      subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppAVar5 = ppAVar5 + 1) {
    ::std::__cxx11::string::string((string *)&group_key,(string *)&(*ppAVar5)->group_);
    if (group_key._M_string_length != 0) {
      _Var2 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::Formatter::make_subcommands(CLI::App_const*,CLI::AppFormatMode)const::_lambda(std::__cxx11::string)_1_>>
                        (subcmd_groups_seen.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         subcmd_groups_seen.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&group_key);
      if (_Var2._M_current ==
          subcmd_groups_seen.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&subcmd_groups_seen,&group_key);
      }
    }
    ::std::__cxx11::string::~string((string *)&group_key);
  }
  pbVar6 = subcmd_groups_seen.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pbVar6 == pbVar1) break;
    poVar3 = ::std::operator<<(local_1a8,"\n");
    poVar3 = ::std::operator<<(poVar3,(string *)pbVar6);
    ::std::operator<<(poVar3,":\n");
    group_key._M_string_length = 0;
    group_key.field_2._8_8_ =
         std::
         _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/benjaminkiesl[P]ut_tamarin/third-party/cli11/CLI11.hpp:3959:13)>
         ::_M_invoke;
    group_key.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/benjaminkiesl[P]ut_tamarin/third-party/cli11/CLI11.hpp:3959:13)>
         ::_M_manager;
    group_key._M_dataplus._M_p = (pointer)pbVar6;
    App::get_subcommands(&subcommands_group,app,(function<bool_(const_CLI::App_*)> *)&group_key);
    std::_Function_base::~_Function_base((_Function_base *)&group_key);
    ppAVar5 = subcommands_group.
              super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppAVar4 = subcommands_group.
                   super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppAVar4 != ppAVar5; ppAVar4 = ppAVar4 + 1) {
      this_00 = *ppAVar4;
      if (mode == All) {
        ::std::__cxx11::string::string((string *)&local_1d8,(string *)&this_00->name_);
        App::help(&group_key,this_00,&local_1d8,Sub);
        ::std::operator<<(local_1a8,(string *)&group_key);
        ::std::__cxx11::string::~string((string *)&group_key);
        ::std::__cxx11::string::~string((string *)&local_1d8);
        if (this_00 !=
            subcommands_group.
            super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]) {
          ::std::operator<<(local_1a8,"\n");
        }
      }
      else {
        (*(this->super_FormatterBase)._vptr_FormatterBase[6])(&group_key,this,this_00);
        ::std::operator<<(local_1a8,(string *)&group_key);
        ::std::__cxx11::string::~string((string *)&group_key);
      }
    }
    std::_Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~_Vector_base
              (&subcommands_group.
                super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>);
    pbVar6 = pbVar6 + 1;
  }
  ::std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&subcmd_groups_seen);
  std::_Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~_Vector_base
            (&subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_subcommands(const App *app, AppFormatMode mode) const {
    std::stringstream out;

    std::vector<const App *> subcommands = app->get_subcommands({});

    // Make a list in definition order of the groups seen
    std::vector<std::string> subcmd_groups_seen;
    for(const App *com : subcommands) {
        std::string group_key = com->get_group();
        if(!group_key.empty() &&
           std::find_if(subcmd_groups_seen.begin(), subcmd_groups_seen.end(), [&group_key](std::string a) {
               return detail::to_lower(a) == detail::to_lower(group_key);
           }) == subcmd_groups_seen.end())
            subcmd_groups_seen.push_back(group_key);
    }

    // For each group, filter out and print subcommands
    for(const std::string &group : subcmd_groups_seen) {
        out << "\n" << group << ":\n";
        std::vector<const App *> subcommands_group = app->get_subcommands(
            [&group](const App *app) { return detail::to_lower(app->get_group()) == detail::to_lower(group); });
        for(const App *new_com : subcommands_group) {
            if(mode != AppFormatMode::All) {
                out << make_subcommand(new_com);
            } else {
                out << new_com->help(new_com->get_name(), AppFormatMode::Sub);
                if(new_com != subcommands_group.back())
                    out << "\n";
            }
        }
    }

    return out.str();
}